

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

Dimensions ftxui::Dimension::Fit(Element *e)

{
  uint uVar1;
  undefined8 in_RAX;
  Dimensions DVar2;
  ulong uVar3;
  element_type *peVar4;
  ulong uVar5;
  ulong uVar6;
  Status status;
  undefined8 local_38;
  
  local_38._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  DVar2 = Full();
  uVar6 = (ulong)DVar2 & 0xffffffff00000000;
  local_38 = (ulong)local_38._5_3_ << 0x28;
  peVar4 = (e->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar4->_vptr_Node[5])(peVar4,&local_38);
  if ((local_38._4_1_ == '\x01') && ((int)local_38 < 0x14)) {
    peVar4 = (e->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    uVar3 = (ulong)DVar2 & 0xffffffff;
    do {
      (*peVar4->_vptr_Node[2])();
      peVar4 = (e->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      uVar1 = (peVar4->requirement_).min_x;
      if ((int)uVar1 < (int)uVar3) {
        uVar3 = (ulong)uVar1;
      }
      uVar1 = (peVar4->requirement_).min_y;
      uVar5 = uVar6 >> 0x20;
      if ((int)uVar1 < (int)(uVar6 >> 0x20)) {
        uVar5 = (ulong)uVar1;
      }
      uVar6 = uVar5 << 0x20;
      (*peVar4->_vptr_Node[3])(peVar4,uVar3 << 0x20,uVar6);
      local_38 = CONCAT44((int)(local_38 >> 0x20),(int)local_38 + 1) & 0xffffff00ffffffff;
      peVar4 = (e->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (*peVar4->_vptr_Node[5])(peVar4,&local_38);
      if (local_38._4_1_ != '\x01') break;
      peVar4 = (e->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      uVar1 = (peVar4->requirement_).min_x;
      uVar3 = (ulong)uVar1;
      if (DVar2.dimx <= (int)uVar1) {
        uVar3 = (ulong)DVar2 & 0xffffffff;
      }
      uVar1 = (peVar4->requirement_).min_y;
      uVar6 = (ulong)uVar1;
      if (DVar2.dimy <= (int)uVar1) {
        uVar6 = (ulong)DVar2 >> 0x20;
      }
      uVar6 = uVar6 << 0x20;
    } while ((int)local_38 < 0x14);
  }
  else {
    uVar3 = (ulong)DVar2 & 0xffffffff;
  }
  return (Dimensions)(uVar3 | uVar6);
}

Assistant:

Dimensions Dimension::Fit(Element& e) {
  const Dimensions fullsize = Dimension::Full();
  Box box;
  box.x_min = 0;
  box.y_min = 0;
  box.x_max = fullsize.dimx;
  box.y_max = fullsize.dimy;

  Node::Status status;
  e->Check(&status);
  const int max_iteration = 20;
  while (status.need_iteration && status.iteration < max_iteration) {
    e->ComputeRequirement();

    // Don't give the element more space than it needs:
    box.x_max = std::min(box.x_max, e->requirement().min_x);
    box.y_max = std::min(box.y_max, e->requirement().min_y);

    e->SetBox(box);
    status.need_iteration = false;
    status.iteration++;
    e->Check(&status);

    if (!status.need_iteration) {
      break;
    }
    // Increase the size of the box until it fits, but not more than the with of
    // the terminal emulator:
    box.x_max = std::min(e->requirement().min_x, fullsize.dimx);
    box.y_max = std::min(e->requirement().min_y, fullsize.dimy);
  }

  return {
      box.x_max,
      box.y_max,
  };
}